

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_FastInst.hpp
# Opt level: O0

TermList __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::InstMatcher::
derefQueryBinding(InstMatcher *this,uint var)

{
  DerefTask elem;
  DerefTask elem_00;
  TermList val_00;
  TermList val_01;
  TermList val_02;
  TermList val_03;
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  undefined7 extraout_var;
  DerefTask *pDVar4;
  TermList *pTVar5;
  InstMatcher *in_RDI;
  TermSpec trm;
  TermList derefTerm;
  DerefApplicator applicator;
  TermSpec tspec;
  TermList btv;
  VariableIterator vit;
  TermList derefBoundTerm;
  TermList bvar;
  TermList val;
  TermSpec varBinding;
  TermList tvar;
  TermList tvar0;
  VariableIterator *in_stack_fffffffffffffe08;
  TermList in_stack_fffffffffffffe10;
  TermList in_stack_fffffffffffffe18;
  TermList in_stack_fffffffffffffe20;
  undefined5 in_stack_fffffffffffffe28;
  undefined1 in_stack_fffffffffffffe2d;
  undefined1 in_stack_fffffffffffffe2e;
  undefined1 in_stack_fffffffffffffe2f;
  TermList in_stack_fffffffffffffe30;
  byte local_1c1;
  DerefTask local_1b0;
  uint64_t local_198;
  uint64_t local_190;
  TermList in_stack_fffffffffffffe78;
  TermList in_stack_fffffffffffffe80;
  DerefApplicator local_178;
  DerefTask local_168;
  TermSpec local_150;
  uint64_t local_140;
  VariableIterator *local_138;
  VariableIterator *pVStack_130;
  DHMap<Kernel::TermList,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::InstMatcher::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>
  *local_128;
  uint64_t local_118;
  uint64_t local_110;
  uint64_t local_b8;
  uint64_t local_b0;
  undefined1 local_a8 [16];
  TermList local_98;
  uint64_t local_90;
  uint64_t local_88;
  uint64_t local_80;
  uint64_t local_78;
  TermList local_70;
  uint64_t local_68;
  undefined8 local_58;
  uint64_t local_50;
  uint64_t local_48;
  TermList local_40;
  byte local_38;
  TermList local_30;
  TermList local_28;
  uint64_t local_20;
  uint64_t local_8;
  
  Kernel::TermList::TermList
            ((TermList *)in_stack_fffffffffffffe10._content,
             (uint)((ulong)in_stack_fffffffffffffe08 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffe08 >> 0x18,0));
  local_28._content = local_20;
  TermSpec::TermSpec((TermSpec *)0x44c756);
  Kernel::TermList::TermList(&local_40);
  bVar2 = Lib::DHMap<Kernel::TermList,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::find
                    ((DHMap<Kernel::TermList,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>
                      *)in_stack_fffffffffffffe18._content,
                     (TermList *)in_stack_fffffffffffffe10._content,
                     (TermList *)in_stack_fffffffffffffe08);
  if (bVar2) {
    local_8 = local_40._content;
  }
  else {
    Lib::
    DHMap<Kernel::TermList,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::InstMatcher::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>
    ::find((DHMap<Kernel::TermList,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::InstMatcher::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>
            *)in_stack_fffffffffffffe18._content,(TermList *)in_stack_fffffffffffffe10._content,
           (TermSpec *)in_stack_fffffffffffffe08);
    bVar2 = TermSpec::isFinal((TermSpec *)in_stack_fffffffffffffe10._content);
    if (bVar2) {
      local_48 = local_28._content;
      local_50 = local_30._content;
      val_00._content._5_1_ = in_stack_fffffffffffffe2d;
      val_00._content._0_5_ = in_stack_fffffffffffffe28;
      val_00._content._6_1_ = in_stack_fffffffffffffe2e;
      val_00._content._7_1_ = in_stack_fffffffffffffe2f;
      Lib::DHMap<Kernel::TermList,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::insert
                ((DHMap<Kernel::TermList,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *)
                 in_stack_fffffffffffffe20._content,in_stack_fffffffffffffe30,val_00);
      local_8 = local_30._content;
    }
    else {
      if ((derefQueryBinding(unsigned_int)::toDo == '\0') &&
         (iVar3 = __cxa_guard_acquire(&derefQueryBinding(unsigned_int)::toDo), iVar3 != 0)) {
        Lib::
        Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::InstMatcher::DerefTask>
        ::Stack((Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::InstMatcher::DerefTask>
                 *)in_stack_fffffffffffffe20._content,in_stack_fffffffffffffe18._content);
        __cxa_atexit(Lib::
                     Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::InstMatcher::DerefTask>
                     ::~Stack,&derefQueryBinding::toDo,&__dso_handle);
        __cxa_guard_release(&derefQueryBinding(unsigned_int)::toDo);
      }
      Lib::
      Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::InstMatcher::DerefTask>
      ::reset(&derefQueryBinding::toDo);
      while( true ) {
        while( true ) {
          bVar2 = TermSpec::isFinal((TermSpec *)in_stack_fffffffffffffe10._content);
          local_1c1 = 0;
          if (!bVar2) {
            bVar2 = Kernel::TermList::isTerm((TermList *)0x44c8b3);
            local_1c1 = bVar2 ^ 0xff;
          }
          if ((local_1c1 & 1) == 0) break;
          local_68 = local_30._content;
          Kernel::TermList::TermList(&local_70);
          bVar2 = Lib::
                  DHMap<Kernel::TermList,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::
                  find((DHMap<Kernel::TermList,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>
                        *)in_stack_fffffffffffffe18._content,
                       (TermList *)in_stack_fffffffffffffe10._content,
                       (TermList *)in_stack_fffffffffffffe08);
          if (bVar2) {
            local_78 = local_28._content;
            local_80 = local_70._content;
            val_01._content._5_1_ = in_stack_fffffffffffffe2d;
            val_01._content._0_5_ = in_stack_fffffffffffffe28;
            val_01._content._6_1_ = in_stack_fffffffffffffe2e;
            val_01._content._7_1_ = in_stack_fffffffffffffe2f;
            bVar2 = Lib::
                    DHMap<Kernel::TermList,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::
                    insert((DHMap<Kernel::TermList,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>
                            *)in_stack_fffffffffffffe20._content,in_stack_fffffffffffffe30,val_01);
            local_58 = CONCAT71(extraout_var,bVar2);
            if (!bVar2) {
              __cxa_guard_abort(&derefQueryBinding(unsigned_int)::toDo);
              _Unwind_Resume(local_58);
            }
          }
          Lib::
          DHMap<Kernel::TermList,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::InstMatcher::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>
          ::find((DHMap<Kernel::TermList,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::InstMatcher::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>
                  *)in_stack_fffffffffffffe18._content,
                 (TermList *)in_stack_fffffffffffffe10._content,
                 (TermSpec *)in_stack_fffffffffffffe08);
        }
        bVar2 = TermSpec::isFinal((TermSpec *)in_stack_fffffffffffffe10._content);
        if (bVar2) {
          local_88 = local_28._content;
          local_90 = local_30._content;
          val_02._content._5_1_ = in_stack_fffffffffffffe2d;
          val_02._content._0_5_ = in_stack_fffffffffffffe28;
          val_02._content._6_1_ = in_stack_fffffffffffffe2e;
          val_02._content._7_1_ = in_stack_fffffffffffffe2f;
          Lib::DHMap<Kernel::TermList,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::
          insert((DHMap<Kernel::TermList,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *)
                 in_stack_fffffffffffffe20._content,in_stack_fffffffffffffe30,val_02);
        }
        else {
          local_b0 = local_28._content;
          local_b8 = local_30._content;
          trm._1_7_ = 0;
          trm.q = (bool)local_38;
          trm.t._content = local_30._content;
          DerefTask::DerefTask((DerefTask *)local_a8,local_28,trm);
          elem.trm._0_5_ = in_stack_fffffffffffffe28;
          elem.var._content = in_stack_fffffffffffffe20._content;
          elem.trm._5_1_ = in_stack_fffffffffffffe2d;
          elem.trm._6_1_ = in_stack_fffffffffffffe2e;
          elem.trm._7_1_ = in_stack_fffffffffffffe2f;
          elem.trm.t._content = in_stack_fffffffffffffe30._content;
          in_stack_fffffffffffffe08 = (VariableIterator *)local_a8._0_8_;
          in_stack_fffffffffffffe10._content = local_a8._8_8_;
          in_stack_fffffffffffffe18._content = local_98._content;
          Lib::
          Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::InstMatcher::DerefTask>
          ::push((Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::InstMatcher::DerefTask>
                  *)local_a8._8_8_,elem);
          local_110 = local_30._content;
          Kernel::VariableIterator::VariableIterator
                    ((VariableIterator *)in_stack_fffffffffffffe78._content,
                     in_stack_fffffffffffffe80);
          while (bVar2 = Kernel::VariableIterator::hasNext
                                   ((VariableIterator *)
                                    CONCAT17(in_stack_fffffffffffffe2f,
                                             CONCAT16(in_stack_fffffffffffffe2e,
                                                      CONCAT15(in_stack_fffffffffffffe2d,
                                                               in_stack_fffffffffffffe28)))), bVar2)
          {
            in_stack_fffffffffffffe30 = Kernel::VariableIterator::next(in_stack_fffffffffffffe08);
            local_118 = in_stack_fffffffffffffe30._content;
            if (((local_38 & 1) != 0) ||
               (in_stack_fffffffffffffe2f = Kernel::TermList::isSpecialVar((TermList *)0x44caf2),
               (bool)in_stack_fffffffffffffe2f)) {
              Lib::DHMap<Kernel::TermList,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::
              find((DHMap<Kernel::TermList,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *
                   )CONCAT17(in_stack_fffffffffffffe2f,
                             CONCAT16(in_stack_fffffffffffffe2e,
                                      CONCAT15(in_stack_fffffffffffffe2d,in_stack_fffffffffffffe28))
                            ),(TermList *)in_stack_fffffffffffffe20._content);
              in_stack_fffffffffffffe2e =
                   Lib::Option::operator_cast_to_bool((Option<Kernel::TermList_&> *)0x44cb32);
              if (((in_stack_fffffffffffffe2e ^ 0xff) & 1) != 0) {
                local_140 = local_118;
                DerefTask::DerefTask
                          ((DerefTask *)in_stack_fffffffffffffe18._content,in_stack_fffffffffffffe20
                          );
                elem_00.trm._0_5_ = in_stack_fffffffffffffe28;
                elem_00.var._content = in_stack_fffffffffffffe20._content;
                elem_00.trm._5_1_ = in_stack_fffffffffffffe2d;
                elem_00.trm._6_1_ = in_stack_fffffffffffffe2e;
                elem_00.trm._7_1_ = in_stack_fffffffffffffe2f;
                elem_00.trm.t._content = in_stack_fffffffffffffe30._content;
                in_stack_fffffffffffffe08 = local_138;
                in_stack_fffffffffffffe10._content = (uint64_t)pVStack_130;
                in_stack_fffffffffffffe18._content = (uint64_t)local_128;
                Lib::
                Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::InstMatcher::DerefTask>
                ::push((Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::InstMatcher::DerefTask>
                        *)pVStack_130,elem_00);
              }
            }
          }
          Kernel::VariableIterator::~VariableIterator
                    ((VariableIterator *)in_stack_fffffffffffffe10._content);
        }
        while( true ) {
          bVar2 = Lib::
                  Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::InstMatcher::DerefTask>
                  ::isNonEmpty(&derefQueryBinding::toDo);
          in_stack_fffffffffffffe2d = false;
          if (bVar2) {
            Lib::
            Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::InstMatcher::DerefTask>
            ::top(&derefQueryBinding::toDo);
            in_stack_fffffffffffffe2d = DerefTask::buildDerefTerm((DerefTask *)0x44cc00);
          }
          if ((bool)in_stack_fffffffffffffe2d == false) break;
          pDVar4 = Lib::
                   Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::InstMatcher::DerefTask>
                   ::top(&derefQueryBinding::toDo);
          local_28._content = (pDVar4->var)._content;
          Lib::
          Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::InstMatcher::DerefTask>
          ::pop(&local_168,&derefQueryBinding::toDo);
          local_150.q = local_168.trm.q;
          local_150._1_7_ = local_168.trm._1_7_;
          uVar1 = local_150._0_8_;
          local_150.t._content = local_168.trm.t._content;
          local_150.q = local_168.trm.q;
          bVar2 = (bool)(local_150.q & 1);
          local_150._0_8_ = uVar1;
          DerefApplicator::DerefApplicator(&local_178,in_RDI,bVar2);
          in_stack_fffffffffffffe78._content = local_150.t._content;
          local_198 = (uint64_t)
                      Kernel::SubstHelper::
                      applySV<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::InstMatcher::DerefApplicator>
                                (in_stack_fffffffffffffe18,in_stack_fffffffffffffe10._content,
                                 SUB81((ulong)in_stack_fffffffffffffe08 >> 0x38,0));
          local_190 = local_28._content;
          val_03._content._5_1_ = in_stack_fffffffffffffe2d;
          val_03._content._0_5_ = in_stack_fffffffffffffe28;
          val_03._content._6_1_ = in_stack_fffffffffffffe2e;
          val_03._content._7_1_ = in_stack_fffffffffffffe2f;
          in_stack_fffffffffffffe80 = (TermList)local_198;
          Lib::DHMap<Kernel::TermList,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::
          insert((DHMap<Kernel::TermList,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *)
                 in_stack_fffffffffffffe20._content,in_stack_fffffffffffffe30,val_03);
        }
        bVar2 = Lib::
                Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::InstMatcher::DerefTask>
                ::isEmpty(&derefQueryBinding::toDo);
        if (bVar2) break;
        Lib::
        Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::InstMatcher::DerefTask>
        ::pop(&local_1b0,&derefQueryBinding::toDo);
        local_28._content = local_1b0.var._content;
        Lib::
        DHMap<Kernel::TermList,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::InstMatcher::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>
        ::find((DHMap<Kernel::TermList,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::InstMatcher::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>
                *)in_stack_fffffffffffffe18._content,(TermList *)in_stack_fffffffffffffe10._content,
               (TermSpec *)in_stack_fffffffffffffe08);
      }
      pTVar5 = Lib::DHMap<Kernel::TermList,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::
               get((DHMap<Kernel::TermList,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *
                   )in_stack_fffffffffffffe08,in_stack_fffffffffffffe10);
      local_8 = pTVar5->_content;
    }
  }
  return (TermList)local_8;
}

Assistant:

TermList SubstitutionTree<LeafData_>::InstMatcher::derefQueryBinding(unsigned var)
{
  TermList tvar0(var, false);
  TermList tvar=tvar0;

  TermSpec varBinding;
  {
    TermList val;
    if(_derefBindings.find(tvar, val)) {
      return val;
    }
    //only bound values can be passed to this function
    ALWAYS(_bindings.find(tvar, varBinding));

    if(varBinding.isFinal()) {
      ALWAYS(_derefBindings.insert(tvar, varBinding.t));
      return varBinding.t;
    }
  }
  static Stack<DerefTask> toDo;
  toDo.reset();

  for(;;) {
    while(!varBinding.isFinal() && !varBinding.t.isTerm()) {
      ASS(varBinding.t.isVar());
      ASS(!varBinding.q || !varBinding.t.isOrdinaryVar());


      TermList bvar=varBinding.t;
      TermList derefBoundTerm;

      if(_derefBindings.find(bvar, derefBoundTerm)) {
	ALWAYS(_derefBindings.insert(tvar, derefBoundTerm));
      }

      ALWAYS(_bindings.find(bvar,varBinding));
    }
    if(varBinding.isFinal()) {
      ALWAYS(_derefBindings.insert(tvar, varBinding.t));
      goto next_loop;
    }
    {
      ASS(varBinding.t.isTerm());
      toDo.push(DerefTask(tvar, varBinding));
      VariableIterator vit(varBinding.t);
      while(vit.hasNext()) {
	TermList btv=vit.next(); //bound term variable
	if(varBinding.q || btv.isSpecialVar()) {
	  ASS(_bindings.find(btv));
	  if(!_derefBindings.find(btv)) {
	    toDo.push(DerefTask(btv));
	  }
	}
      }
    }
    next_loop:
    while(toDo.isNonEmpty() && toDo.top().buildDerefTerm()) {
      tvar=toDo.top().var;
      TermSpec tspec=toDo.pop().trm;
      DerefApplicator applicator(this, tspec.q);
      TermList derefTerm=SubstHelper::applySV(tspec.t, applicator);
      ASS_REP(!derefTerm.isTerm() || derefTerm.term()->shared(), derefTerm);
      ALWAYS(_derefBindings.insert(tvar, derefTerm));
    }
    if(toDo.isEmpty()) {
      break;
    }
    tvar=toDo.pop().var;
    ALWAYS(_bindings.find(tvar, varBinding));
  };
  return _derefBindings.get(tvar0);
}